

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::QualifiedOneofCaseConstantName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field)

{
  OneofDescriptor *pOVar1;
  LogMessage *pLVar2;
  Descriptor *this_00;
  Descriptor *d;
  FieldDescriptor *field_00;
  string local_128;
  AlphaNum local_108;
  AlphaNum local_d8;
  AlphaNum local_a8;
  undefined1 local_78 [8];
  string qualification;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  LogMessageFatal local_30 [23];
  Voidify local_19;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  
  local_18 = (FieldDescriptor *)this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  pOVar1 = FieldDescriptor::containing_oneof((FieldDescriptor *)this);
  if (pOVar1 != (OneofDescriptor *)0x0) {
    this_00 = FieldDescriptor::containing_type(local_18);
    QualifiedClassName_abi_cxx11_((string *)local_78,(cpp *)this_00,d);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_a8,(string *)local_78);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_d8,"::");
    OneofCaseConstantName_abi_cxx11_(&local_128,(cpp *)local_18,field_00);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_108,&local_128);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_a8,&local_d8);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)local_78);
    return __return_storage_ptr__;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,"field->containing_oneof()");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/helpers.cc"
             ,0x23e,local_40._M_len,local_40._M_str);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_30);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
}

Assistant:

std::string QualifiedOneofCaseConstantName(const FieldDescriptor* field) {
  ABSL_DCHECK(field->containing_oneof());
  const std::string qualification =
      QualifiedClassName(field->containing_type());
  return absl::StrCat(qualification, "::", OneofCaseConstantName(field));
}